

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O1

void free_line(LINE_DATA *line)

{
  LINE_DATA **ppLVar1;
  LINE_DATA *pLVar2;
  LINE_DATA *pLVar3;
  long lVar4;
  
  free_pstring(line->text);
  pLVar2 = line->next;
  if (pLVar2 != (LINE_DATA *)0x0) {
    pLVar3 = line->prev;
    if (pLVar3 == (LINE_DATA *)0x0) {
      lVar4 = 0x20;
      pLVar3 = line;
    }
    else {
      pLVar3->next = pLVar2;
      lVar4 = 0x10;
      pLVar2 = pLVar3;
      pLVar3 = (LINE_DATA *)&line->next;
    }
    *(LINE_DATA **)((long)&pLVar3->speech->mob + lVar4) = pLVar2;
  }
  pLVar2 = line;
  if (line == (LINE_DATA *)0x0) {
    return;
  }
  do {
    pLVar2->number = pLVar2->number + -1;
    ppLVar1 = &pLVar2->next;
    pLVar2 = *ppLVar1;
  } while (*ppLVar1 != (LINE_DATA *)0x0);
  operator_delete(line,0x30);
  return;
}

Assistant:

void free_line(LINE_DATA *line)
{
	LINE_DATA *lptr;

	free_pstring(line->text);

	if (line->next)
	{
		if (line->prev)
		{
			line->prev->next = line->next;
			line->next->prev = line->prev;
		}
		else
		{
			line->speech->first_line = line->next;
		}
	}

	for (lptr = line; lptr; lptr = lptr->next)
	{
		lptr->number--;
	}

	delete line;
}